

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

string * __thiscall
CLI::Formatter::make_help
          (string *__return_storage_ptr__,Formatter *this,App *app,string *name,AppFormatMode mode)

{
  stringstream out;
  string sStack_1f8;
  string local_1d8 [32];
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  if (mode == Sub) {
    (*(this->super_FormatterBase)._vptr_FormatterBase[7])(__return_storage_ptr__,this,app);
  }
  else {
    ::std::__cxx11::stringstream::stringstream(local_1b8);
    (*(this->super_FormatterBase)._vptr_FormatterBase[9])(&sStack_1f8,this,app);
    ::std::operator<<(local_1a8,(string *)&sStack_1f8);
    ::std::__cxx11::string::~string((string *)&sStack_1f8);
    ::std::__cxx11::string::string(local_1d8,(string *)name);
    (*(this->super_FormatterBase)._vptr_FormatterBase[10])(&sStack_1f8,this,app,local_1d8);
    ::std::operator<<(local_1a8,(string *)&sStack_1f8);
    ::std::__cxx11::string::~string((string *)&sStack_1f8);
    ::std::__cxx11::string::~string(local_1d8);
    (*(this->super_FormatterBase)._vptr_FormatterBase[4])(&sStack_1f8,this,app);
    ::std::operator<<(local_1a8,(string *)&sStack_1f8);
    ::std::__cxx11::string::~string((string *)&sStack_1f8);
    make_groups_abi_cxx11_(&sStack_1f8,this,app,mode);
    ::std::operator<<(local_1a8,(string *)&sStack_1f8);
    ::std::__cxx11::string::~string((string *)&sStack_1f8);
    (*(this->super_FormatterBase)._vptr_FormatterBase[5])(&sStack_1f8,this,app,(ulong)mode);
    ::std::operator<<(local_1a8,(string *)&sStack_1f8);
    ::std::__cxx11::string::~string((string *)&sStack_1f8);
    (*(this->super_FormatterBase)._vptr_FormatterBase[8])(&sStack_1f8,this,app);
    ::std::operator<<(local_1a8,(string *)&sStack_1f8);
    ::std::__cxx11::string::~string((string *)&sStack_1f8);
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::stringstream::~stringstream(local_1b8);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string Formatter::make_help(const App *app, std::string name, AppFormatMode mode) const {

    // This immediatly forwards to the make_expanded method. This is done this way so that subcommands can
    // have overridden formatters
    if(mode == AppFormatMode::Sub)
        return make_expanded(app);

    std::stringstream out;

    out << make_description(app);
    out << make_usage(app, name);
    out << make_positionals(app);
    out << make_groups(app, mode);
    out << make_subcommands(app, mode);
    out << make_footer(app);

    return out.str();
}